

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

void ImGui::TableBeginCell(ImGuiTable *table,int column_n)

{
  ImVec4 *pIVar1;
  float fVar2;
  ImGuiWindow *pIVar3;
  ImDrawList *pIVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  ImVec2 IVar8;
  ImGuiTableColumn *pIVar9;
  uint uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  
  if ((column_n < 0) ||
     (pIVar9 = (table->Columns).Data + column_n, (table->Columns).DataEnd <= pIVar9)) {
    __assert_fail("p >= Data && p < DataEnd",
                  "/workspace/llm4binary/github/license_c_cmakelists/inflex[P]OpenBoardView/src/imgui/imgui_internal.h"
                  ,0x20b,"T &ImSpan<ImGuiTableColumn>::operator[](int) [T = ImGuiTableColumn]");
  }
  pIVar3 = table->InnerWindow;
  table->CurrentColumn = column_n;
  fVar2 = pIVar9->WorkMinX;
  fVar13 = fVar2;
  if ((pIVar9->Flags & 0x8000) != 0) {
    fVar13 = table->RowIndentOffsetX + fVar2;
  }
  (pIVar3->DC).CursorPos.x = fVar13;
  fVar11 = table->RowPosY1 + table->CellPaddingY;
  (pIVar3->DC).CursorPos.y = fVar11;
  (pIVar3->DC).CursorMaxPos.x = fVar13;
  (pIVar3->DC).ColumnsOffset.x = (fVar13 - (pIVar3->Pos).x) - (pIVar3->DC).Indent.x;
  (pIVar3->DC).CurrLineTextBaseOffset = table->RowTextBaseline;
  (pIVar3->DC).LastItemId = 0;
  (pIVar3->DC).NavLayerCurrent = (int)pIVar9->NavLayerCurrent;
  (pIVar3->WorkRect).Min.y = fVar11;
  (pIVar3->WorkRect).Min.x = fVar2;
  (pIVar3->WorkRect).Max.x = pIVar9->WorkMaxX;
  (pIVar3->DC).ItemWidth = pIVar9->ItemWidth;
  if (pIVar9->IsEnabled == false) {
    uVar10 = -(uint)(table->RowPosY2 <= fVar11);
    (pIVar3->DC).CursorPos.y = (float)(~uVar10 & (uint)table->RowPosY2 | (uint)fVar11 & uVar10);
  }
  pIVar3->SkipItems = pIVar9->IsSkipItems;
  if ((table->Flags & 0x100000) == 0) {
    IVar8 = (pIVar9->ClipRect).Max;
    fVar5 = (pIVar9->ClipRect).Min.x;
    fVar6 = (pIVar9->ClipRect).Min.y;
    fVar7 = (pIVar9->ClipRect).Max.x;
    fVar2 = (pIVar9->ClipRect).Min.x;
    fVar13 = (pIVar9->ClipRect).Min.y;
    fVar11 = (pIVar9->ClipRect).Max.x;
    fVar12 = (pIVar9->ClipRect).Max.y;
    (pIVar3->ClipRect).Min = (pIVar9->ClipRect).Min;
    (pIVar3->ClipRect).Max = IVar8;
    pIVar4 = pIVar3->DrawList;
    (pIVar4->_CmdHeader).ClipRect.x = fVar2;
    (pIVar4->_CmdHeader).ClipRect.y = fVar13;
    (pIVar4->_CmdHeader).ClipRect.z = fVar11;
    (pIVar4->_CmdHeader).ClipRect.w = fVar12;
    pIVar1 = (pIVar3->DrawList->_ClipRectStack).Data +
             (long)(pIVar3->DrawList->_ClipRectStack).Size + -1;
    pIVar1->x = fVar5;
    pIVar1->y = fVar6;
    pIVar1->z = fVar7;
    pIVar1->w = fVar12;
    ImDrawListSplitter::SetCurrentChannel
              (&table->DrawSplitter,pIVar3->DrawList,(uint)pIVar9->DrawChannelCurrent);
    return;
  }
  ImDrawListSplitter::SetCurrentChannel(&table->DrawSplitter,pIVar3->DrawList,2);
  return;
}

Assistant:

inline T&           operator[](int i)           { T* p = Data + i; IM_ASSERT(p >= Data && p < DataEnd); return *p; }